

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<float>(string *__return_storage_ptr__,float value,int precision)

{
  uint uVar1;
  ReusableStringStream *pRVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  string local_78 [32];
  long local_58;
  size_t i;
  undefined1 local_48 [8];
  ReusableStringStream rss;
  allocator<char> local_19;
  int local_18;
  float local_14;
  int precision_local;
  float value_local;
  string *d;
  
  local_18 = precision;
  local_14 = value;
  _precision_local = __return_storage_ptr__;
  uVar1 = isnan((double)(ulong)(uint)value);
  if ((uVar1 & 1) == 0) {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_48);
    i._4_4_ = clara::std::setprecision(local_18);
    pRVar2 = ReusableStringStream::operator<<
                       ((ReusableStringStream *)local_48,(_Setprecision *)((long)&i + 4));
    pRVar2 = ReusableStringStream::operator<<(pRVar2,clara::std::fixed);
    ReusableStringStream::operator<<(pRVar2,&local_14);
    i._3_1_ = 0;
    ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_48);
    lVar3 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
    local_58 = lVar3;
    if ((lVar3 != -1) && (lVar4 = std::__cxx11::string::size(), lVar3 != lVar4 + -1)) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      if (*pcVar5 == '.') {
        local_58 = local_58 + 1;
      }
      std::__cxx11::string::substr((ulong)local_78,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_78);
      std::__cxx11::string::~string(local_78);
    }
    i._3_1_ = 1;
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nan",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString( T value, int precision ) {
    if (Catch::isnan(value)) {
        return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}